

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O0

string * directories::MADPGetProblemFilename_abi_cxx11_(Arguments *args)

{
  string *in_RSI;
  string *in_RDI;
  string *in_stack_00000298;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  string *problem;
  
  if (*(int *)((long)&in_RSI[3]._M_string_length + 4) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(allocator<char> *)in_RDI);
    MADPGetProblemFilename(in_stack_00000298);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  }
  else {
    problem = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(allocator<char> *)in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(allocator<char> *)in_RDI);
    MADPGetProblemFilename(problem,in_RSI);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return in_RDI;
}

Assistant:

string directories::MADPGetProblemFilename(const 
                                           ArgumentHandlers::Arguments &args)
{
    if(args.isTOI)
        return(MADPGetProblemFilename(args.dpf,"toi-dpomdp"));
    else
        return(MADPGetProblemFilename(args.dpf));
}